

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O1

bool __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
run(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this,
   StatePtr *start_state,StatePtr *goal_state)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int *piVar2;
  double dVar3;
  element_type *peVar4;
  long lVar5;
  pointer psVar6;
  iterator iVar7;
  pointer psVar8;
  double dVar9;
  pointer psVar10;
  bool bVar11;
  int iVar12;
  mapped_type *pmVar13;
  rep rVar14;
  pointer pHVar15;
  long lVar16;
  element_type *peVar17;
  Heap<double> *pHVar18;
  pointer psVar19;
  long lVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  shared_ptr<sliding_puzzle::SlidingPuzzleState> *incons_state;
  long lVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  SearchVertexPtr vertex_copy;
  Heap<double> unit_open_inad;
  SearchVertexPtr open_inad_vertex;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  local_158;
  StatePtr *local_138;
  StatePtr *local_130;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_110;
  Heap<double> local_108;
  Heap<double> *local_f0;
  undefined1 local_e8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  Ptr local_c8;
  Ptr local_b8;
  Ptr local_a8;
  Ptr local_98;
  Ptr local_88;
  Ptr local_78;
  Ptr local_68;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,std::allocator<double>> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState> *local_40;
  _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_38;
  
  local_128.
  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138 = goal_state;
  local_130 = start_state;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::allocator<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_128.
              super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
             (Vertex<sliding_puzzle::SlidingPuzzleState,_double> **)&local_128,
             (allocator<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
             &local_158,start_state);
  psVar10 = local_128.
            super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  psVar6 = local_128.
           super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_128.
  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var21 = (this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            ).start_vertex_.
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  start_vertex_.
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)psVar6;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  start_vertex_.
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar10;
  if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
  }
  local_110 = &(this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).start_vertex_.
               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_128.
      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_128.
               super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var1 = local_110;
  peVar4 = (this->
           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
           ).start_vertex_.
           super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (peVar4->self_ptr_).
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar4->self_ptr_).
              super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,local_110);
  peVar4 = (this->
           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
           ).start_vertex_.
           super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar4->g_cost_ = 0.0;
  peVar4->root_id_ = 1;
  peVar4->depth_ = 0;
  pmVar13 = std::__detail::
            _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,local_130);
  (pmVar13->
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).start_vertex_.
             super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar13->
              super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount,p_Var1);
  pHVar18 = &(this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).open_;
  local_68.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &((this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).start_vertex_.
             super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->super_Element;
  local_68.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->
       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
       start_vertex_.
       super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_68.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_68.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_68.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  csbpl_common::Heap<double>::insert(pHVar18,&local_68);
  if (local_68.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_78.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &((this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).start_vertex_.
             super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->super_Element;
  local_78.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->
       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
       start_vertex_.
       super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_78.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  csbpl_common::Heap<double>::decreaseKey(pHVar18,&local_78,0.0);
  local_f0 = pHVar18;
  if (local_78.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (0 < (this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          .params_.num_inad_) {
    local_108.data_.
    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->open_inad_;
    lVar22 = 0;
    lVar16 = 0;
    lVar20 = 0;
    do {
      local_158.
      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::allocator<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_158.
                  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
                 (Vertex<sliding_puzzle::SlidingPuzzleState,_double> **)&local_158,
                 (allocator<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
                 &local_128,local_130);
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::push_back(&((this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).start_vertex_.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->mha_copy_,(value_type *)&local_158);
      peVar4 = (this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).start_vertex_.
               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar5 = *(long *)((long)&(((peVar4->mha_copy_).
                                 super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar16);
      *(element_type **)(lVar5 + 0x48) = peVar4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar5 + 0x50),local_110);
      local_128.
      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::
      push_back((vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_> *)
                local_108.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&local_128);
      pHVar15 = (this->open_inad_).
                super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = (((this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).start_vertex_.
                 super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->mha_copy_).
               super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)
                ((long)&(psVar6->
                        super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + lVar16);
      local_88.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(psVar6->
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi + lVar16);
      if (local_88.
          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_88.
           super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_88.
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_88.
           super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_88.
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      csbpl_common::Heap<double>::insert
                ((Heap<double> *)
                 ((long)&(pHVar15->data_).
                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar22),&local_88);
      if (local_88.
          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.
                   super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pHVar15 = (this->open_inad_).
                super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = (((this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).start_vertex_.
                 super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->mha_copy_).
               super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_98.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)
                ((long)&(psVar6->
                        super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + lVar16);
      local_98.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(psVar6->
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi + lVar16);
      if (local_98.
          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_98.
           super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_98.
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_98.
           super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_98.
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      csbpl_common::Heap<double>::decreaseKey
                ((Heap<double> *)
                 ((long)&(pHVar15->data_).
                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar22),&local_98,0.0);
      if (local_98.
          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.
                   super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      csbpl_common::Heap<double>::clear((Heap<double> *)&local_128);
      std::
      vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
      ::~vector((vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                 *)&local_128);
      if ((element_type *)
          local_158.
          super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_158.
                   super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      lVar20 = lVar20 + 1;
      lVar16 = lVar16 + 0x10;
      lVar22 = lVar22 + 0x18;
    } while (lVar20 < (this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).params_.num_inad_);
  }
  local_128.
  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::allocator<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_128.
              super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
             (Vertex<sliding_puzzle::SlidingPuzzleState,_double> **)&local_128,
             (allocator<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
             &local_158,local_138);
  psVar10 = local_128.
            super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  psVar6 = local_128.
           super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_128.
  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var21 = (this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            ).goal_vertex_.
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  goal_vertex_.
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)psVar6;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  goal_vertex_.
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar10;
  if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
  }
  p_Var1 = &(this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            ).goal_vertex_.
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_128.
      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_128.
               super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  pmVar13 = std::__detail::
            _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,local_138);
  (pmVar13->
  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).goal_vertex_.
             super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar13->
              super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount,p_Var1);
  if (0 < (this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          .params_.num_inad_) {
    lVar16 = 0;
    lVar20 = 0;
    do {
      local_128.
      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::allocator<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_128.
                  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
                 (Vertex<sliding_puzzle::SlidingPuzzleState,_double> **)&local_128,
                 (allocator<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
                 &local_158,local_138);
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::push_back(&((this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).goal_vertex_.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->mha_copy_,(value_type *)&local_128);
      peVar4 = (this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).goal_vertex_.
               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar22 = *(long *)((long)&(((peVar4->mha_copy_).
                                  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar16);
      *(element_type **)(lVar22 + 0x48) = peVar4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar22 + 0x50),p_Var1);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_128.
          super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_128.
                   super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      lVar20 = lVar20 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar20 < (this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).params_.num_inad_);
  }
  rVar14 = std::chrono::_V2::system_clock::now();
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.start_time_.__d.__r = rVar14;
  iVar12 = (*(this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             )._vptr_Dijkstra[4])(this);
  pHVar18 = local_f0;
  if ((char)iVar12 != '\0') {
    sliding_puzzle::SlidingPuzzle::getGoalState
              ((this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).env_ptr_.
               super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
    backtrackPath((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                   *)&local_128,
                  &this->
                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ,(StatePtr *)&local_158);
    if ((element_type *)
        local_158.
        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_158.
                 super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
    ::push_back(&(this->anytime_stats_).solution_paths_,(value_type *)&local_128);
    local_158.
    super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((this->
                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                   ).params_.eps_ *
                  (this->
                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ).params_.mha_eps_);
    iVar7._M_current =
         (this->anytime_stats_).solution_eps_.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->anytime_stats_).solution_eps_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&(this->anytime_stats_).solution_eps_,iVar7,(double *)&local_158);
    }
    else {
      *iVar7._M_current =
           (double)local_158.
                   super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      (this->anytime_stats_).solution_eps_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
    }
    lVar16 = std::chrono::_V2::system_clock::now();
    local_158.
    super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((double)(lVar16 - (this->
                                     super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                     ).params_.start_time_.__d.__r) / 1000000000.0);
    iVar7._M_current =
         (this->anytime_stats_).solution_time_.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->anytime_stats_).solution_time_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&(this->anytime_stats_).solution_time_,
                 iVar7,(double *)&local_158);
    }
    else {
      *iVar7._M_current =
           (double)local_158.
                   super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      (this->anytime_stats_).solution_time_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
    }
    lVar16 = std::chrono::_V2::system_clock::now();
    local_108.data_.
    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((double)(lVar16 - (this->
                                     super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                     ).params_.start_time_.__d.__r) / 1000000000.0);
    iVar7._M_current =
         (this->anytime_stats_).cummulative_time_.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar7._M_current ==
        (this->anytime_stats_).cummulative_time_.super__Vector_base<double,_std::allocator<double>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&(this->anytime_stats_).cummulative_time_,iVar7,(double *)&local_108);
    }
    else {
      *iVar7._M_current =
           (double)local_108.data_.
                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      (this->anytime_stats_).cummulative_time_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
    }
    std::
    vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
    ::~vector((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
               *)&local_128);
  }
  lVar20 = std::chrono::_V2::system_clock::now();
  lVar16 = (this->
           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
           ).params_.start_time_.__d.__r;
  dVar25 = (this->
           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
           ).params_.mha_eps_;
  dVar9 = (this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          .params_.eps_ -
          (this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          .params_.delta_eps_;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.eps_ = dVar9;
  dVar25 = dVar25 - (this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).params_.delta_mha_eps_;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.mha_eps_ = dVar25;
  local_110 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((double)(lVar20 - lVar16) / 1000000000.0);
  dVar3 = (this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          .params_.time_limit_;
  uVar23 = SUB84(dVar3,0);
  uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
  if (((1.0 <= dVar9) && (1.0 <= dVar25)) && ((double)local_110 < dVar3)) {
    local_108.data_.
    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)&(this->
                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                   ).closed_;
    local_38 = &(this->closed_inad_)._M_h;
    local_40 = &this->anytime_stats_;
    local_48 = &(this->anytime_stats_).solution_eps_;
    local_50 = (vector<double,std::allocator<double>> *)&(this->anytime_stats_).solution_time_;
    local_58 = &(this->anytime_stats_).cummulative_time_;
    do {
      local_128.
      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar8 = (this->incons_).
               super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar19 = (this->incons_).
                     super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar19 != psVar8;
          psVar19 = psVar19 + 1) {
        pmVar13 = std::__detail::
                  _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)(this->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).env_ptr_.
                                  super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,psVar19);
        local_158.
        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(pmVar13->
                      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
        local_158.
        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)(pmVar13->
                      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount._M_pi;
        if ((element_type *)
            local_158.
            super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar2 = &(((element_type *)
                       local_158.
                       super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->super_Element).heap_index_;
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          else {
            piVar2 = &(((element_type *)
                       local_158.
                       super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->super_Element).heap_index_;
            *piVar2 = *piVar2 + 1;
          }
        }
        local_130 = (StatePtr *)
                    ((element_type *)
                    local_158.
                    super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->g_cost_;
        local_138 = (StatePtr *)
                    (this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).params_.eps_;
        dVar25 = sliding_puzzle::SlidingPuzzle::getAdmissibleHeuristicCost
                           ((this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,psVar19);
        *(double *)
         ((long)local_158.
                super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 0x80) =
             (double)local_138 * dVar25 + (double)local_130;
        std::
        vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ::push_back(&local_128,(value_type *)&local_158);
        if ((element_type *)
            local_158.
            super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_158.
                     super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      while (psVar6 = local_128.
                      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_128.
                      super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            0 < (int)((ulong)((long)(this->
                                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                    ).open_.data_.
                                    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->
                                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                   ).open_.data_.
                                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        csbpl_common::Heap<double>::remove(&local_108,(char *)pHVar18);
        local_158.
        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)local_108.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_158.
        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_108.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        if ((element_type *)
            local_108.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar2 = &((Element *)
                      &(local_108.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      )->heap_index_;
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          else {
            piVar2 = &((Element *)
                      &(local_108.data_.
                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      )->heap_index_;
            *piVar2 = *piVar2 + 1;
          }
        }
        if ((element_type *)
            local_108.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_108.data_.
                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        local_130 = *(StatePtr **)
                     ((long)local_158.
                            super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 0x68);
        local_138 = (StatePtr *)
                    (this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).params_.eps_;
        dVar25 = sliding_puzzle::SlidingPuzzle::getAdmissibleHeuristicCost
                           ((this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(StatePtr *)
                                    ((long)local_158.
                                           super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 0x10));
        *(double *)
         ((long)local_158.
                super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 0x80) =
             (double)local_138 * dVar25 + (double)local_130;
        std::
        vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ::push_back(&local_128,(value_type *)&local_158);
        if ((element_type *)
            local_158.
            super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_158.
                     super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      for (; p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar6;
          p_Var21 = p_Var21 + 1) {
        local_a8.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)p_Var21->_vptr__Sp_counted_base;
        local_a8.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var21->_M_use_count;
        if (local_a8.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_a8.
             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_a8.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_a8.
             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_a8.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        csbpl_common::Heap<double>::insert(pHVar18,&local_a8);
        if (local_a8.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.
                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_b8.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)p_Var21->_vptr__Sp_counted_base;
        local_b8.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var21->_M_use_count;
        if (local_b8.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_b8.
             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_b8.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_b8.
             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_b8.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        csbpl_common::Heap<double>::decreaseKey
                  (pHVar18,&local_b8,(double)p_Var21->_vptr__Sp_counted_base[0x10]);
        if (local_b8.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.
                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      std::
      _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear((_Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_108.data_.
                 super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (0 < (this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.num_inad_) {
        lVar16 = 0;
        do {
          local_158.
          super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.
          super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.
          super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
          ::reserve(&local_158,
                    ((long)(this->incons_inad_).
                           super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->incons_inad_).
                           super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) +
                    ((long)(this->open_inad_).
                           super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->open_inad_).
                           super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
          psVar8 = (this->incons_inad_).
                   super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar19 = (this->incons_inad_).
                         super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar19 != psVar8;
              psVar19 = psVar19 + 1) {
            pmVar13 = std::__detail::
                      _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(this->
                                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                      ).env_ptr_.
                                      super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,psVar19);
            peVar4 = (pmVar13->
                     super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            p_Var21 = (pmVar13->
                      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount._M_pi;
            if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              }
            }
            local_130 = (StatePtr *)peVar4->g_cost_;
            local_138 = (StatePtr *)
                        (this->
                        super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                        ).params_.eps_;
            dVar25 = sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
                               ((this->
                                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                ).env_ptr_.
                                super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,psVar19,(int)lVar16);
            psVar6 = (peVar4->mha_copy_).
                     super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(double *)
             (*(long *)&psVar6[lVar16].
                        super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
             + 0x80) = (double)local_138 * dVar25 + (double)local_130;
            std::
            vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
            ::push_back(&local_158,psVar6 + lVar16);
            if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
            }
          }
          pHVar15 = (this->open_inad_).
                    super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          peVar17 = (element_type *)
                    local_158.
                    super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          peVar4 = (element_type *)
                   local_158.
                   super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (0 < (int)((ulong)((long)pHVar15[lVar16].data_.
                                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               *(long *)&pHVar15[lVar16].data_.
                                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                         ._M_impl) >> 4)) {
            pHVar15 = pHVar15 + lVar16;
            do {
              csbpl_common::Heap<double>::remove((Heap<double> *)local_e8,(char *)pHVar15);
              local_108.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._0_8_;
              local_108.data_.
              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
              if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  piVar2 = &((Element *)local_e8._8_8_)->heap_index_;
                  *piVar2 = *piVar2 + 1;
                  UNLOCK();
                }
                else {
                  piVar2 = &((Element *)local_e8._8_8_)->heap_index_;
                  *piVar2 = *piVar2 + 1;
                }
              }
              if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
              }
              local_130 = (StatePtr *)
                          ((((Ptr *)((long)local_108.data_.
                                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 0x48))->
                           super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->g_cost_;
              local_138 = (StatePtr *)
                          (this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).params_.eps_;
              dVar25 = sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
                                 ((this->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).env_ptr_.
                                  super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(StatePtr *)
                                          ((long)local_108.data_.
                                                 super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 0x10),
                                  (int)lVar16);
              *(double *)
               ((long)local_108.data_.
                      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0x80) =
                   (double)local_138 * dVar25 + (double)local_130;
              std::
              vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
              ::push_back(&local_158,(value_type *)&local_108);
              if ((element_type *)
                  local_108.data_.
                  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_108.data_.
                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              pHVar15 = (this->open_inad_).
                        super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar16;
              peVar17 = (element_type *)
                        local_158.
                        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar4 = (element_type *)
                       local_158.
                       super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            } while (0 < (int)((ulong)((long)(pHVar15->data_).
                                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      *(long *)&(pHVar15->data_).
                                                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                                ._M_impl) >> 4));
          }
          for (; peVar17 != peVar4; peVar17 = (element_type *)&peVar17->state_) {
            pHVar15 = (this->open_inad_).
                      super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_c8.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)(peVar17->super_Element).key_;
            local_c8.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  &(peVar17->super_Element).heap_index_;
            if (local_c8.
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_c8.
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_c8.
                      super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_c8.
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_c8.
                      super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            csbpl_common::Heap<double>::insert(pHVar15 + lVar16,&local_c8);
            if (local_c8.
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c8.
                         super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            pHVar15 = (this->open_inad_).
                      super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_e8._16_8_ = (peVar17->super_Element).key_;
            local_d0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                        &(peVar17->super_Element).heap_index_;
            if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_d0->_M_use_count = local_d0->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_d0->_M_use_count = local_d0->_M_use_count + 1;
              }
            }
            csbpl_common::Heap<double>::decreaseKey
                      (pHVar15 + lVar16,(Ptr *)(local_e8 + 0x10),
                       *(double *)((long)(peVar17->super_Element).key_ + 0x80));
            if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
            }
          }
          std::
          vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
          ::~vector(&local_158);
          lVar16 = lVar16 + 1;
          pHVar18 = local_f0;
        } while (lVar16 < (this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).params_.num_inad_);
      }
      std::
      _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(local_38);
      iVar12 = (*(this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 )._vptr_Dijkstra[4])(this);
      if ((char)iVar12 != '\0') {
        sliding_puzzle::SlidingPuzzle::getGoalState
                  ((this->
                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                   ).env_ptr_.
                   super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
        backtrackPath((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                       *)&local_158,
                      &this->
                       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ,(StatePtr *)&local_108);
        if ((element_type *)
            local_108.data_.
            super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_108.data_.
                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::
        vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
        ::push_back(&local_40->solution_paths_,(value_type *)&local_158);
        local_108.data_.
        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((this->
                       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                       ).params_.eps_ *
                      (this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).params_.mha_eps_);
        iVar7._M_current =
             (this->anytime_stats_).solution_eps_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar7._M_current ==
            (this->anytime_stats_).solution_eps_.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_48,iVar7,(double *)&local_108);
        }
        else {
          *iVar7._M_current =
               (double)local_108.data_.
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          (this->anytime_stats_).solution_eps_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        uVar23 = 0;
        uVar24 = 0;
        if ((this->anytime_stats_).solution_time_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            (this->anytime_stats_).solution_time_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          uVar23 = SUB84(local_110,0);
          uVar24 = (undefined4)((ulong)local_110 >> 0x20);
        }
        local_138 = (StatePtr *)CONCAT44(uVar24,uVar23);
        lVar16 = std::chrono::_V2::system_clock::now();
        local_108.data_.
        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((double)(lVar16 - (this->
                                         super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                         ).params_.start_time_.__d.__r) / 1000000000.0 -
                      (double)local_138);
        iVar7._M_current =
             (this->anytime_stats_).solution_time_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar7._M_current ==
            (this->anytime_stats_).solution_time_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_50,iVar7,(double *)&local_108);
        }
        else {
          *iVar7._M_current =
               (double)local_108.data_.
                       super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          (this->anytime_stats_).solution_time_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        lVar16 = std::chrono::_V2::system_clock::now();
        local_e8._0_8_ =
             (double)(lVar16 - (this->
                               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                               ).params_.start_time_.__d.__r) / 1000000000.0;
        iVar7._M_current =
             (this->anytime_stats_).cummulative_time_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar7._M_current ==
            (this->anytime_stats_).cummulative_time_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_58,iVar7,(double *)local_e8);
        }
        else {
          *iVar7._M_current = (double)local_e8._0_8_;
          (this->anytime_stats_).cummulative_time_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar7._M_current + 1;
        }
        std::
        vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
        ::~vector((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                   *)&local_158);
      }
      dVar25 = (this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).params_.mha_eps_;
      (this->
      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
      params_.eps_ = (this->
                     super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                     ).params_.eps_ -
                     (this->
                     super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                     ).params_.delta_eps_;
      (this->
      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
      params_.mha_eps_ =
           dVar25 - (this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).params_.delta_mha_eps_;
      lVar20 = std::chrono::_V2::system_clock::now();
      lVar16 = (this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).params_.start_time_.__d.__r;
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::~vector(&local_128);
      local_110 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((double)(lVar20 - lVar16) / 1000000000.0);
      dVar25 = (this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).params_.time_limit_;
      uVar23 = SUB84(dVar25,0);
      uVar24 = (undefined4)((ulong)dVar25 >> 0x20);
    } while (((1.0 <= (this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).params_.eps_) &&
             (1.0 <= (this->
                     super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                     ).params_.mha_eps_)) && ((double)local_110 < dVar25));
  }
  bVar11 = true;
  if (((double)CONCAT44(uVar24,uVar23) <= (double)local_110 &&
       (double)local_110 != (double)CONCAT44(uVar24,uVar23)) &&
     ((this->anytime_stats_).solution_paths_.
      super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->anytime_stats_).solution_paths_.
      super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "[AMHAStar::run] Time limit exceeded and no solution found... Exiting!",0x45);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

virtual bool run(StatePtr& start_state,
                     StatePtr& goal_state)
    {
      
      this->start_vertex_ = std::make_shared<SearchVertex>(start_state);
      this->start_vertex_->self_ptr_ = this->start_vertex_;
      this->start_vertex_->g_cost_ = 0;
      this->start_vertex_->root_id_ = 1;
      this->start_vertex_->depth_ = 0;
      this->env_ptr_->explored_[start_state] = this->start_vertex_;
      
      this->open_.insert(this->start_vertex_);
      this->open_.decreaseKey(this->start_vertex_, 0.0);
      
      for (int i=0; i<this->params_.num_inad_; ++i)
      {
        // Duplicating vertex
        // @FIXME Why am I using std::move() here?
        SearchVertexPtr vertex_copy = std::make_shared<SearchVertex>(std::move(start_state));
        this->start_vertex_->mha_copy_.push_back(vertex_copy);
        this->start_vertex_->mha_copy_[i]->self_ptr_ = this->start_vertex_;
        
        csbpl_common::Heap<HeapValueType> unit_open_inad;
        open_inad_.push_back(unit_open_inad);
        
        open_inad_[i].insert(this->start_vertex_->mha_copy_[i]);
        open_inad_[i].decreaseKey(this->start_vertex_->mha_copy_[i], 0.0);
      }
      
      this->goal_vertex_ = std::make_shared<SearchVertex>(goal_state);
      this->env_ptr_->explored_[goal_state] = this->goal_vertex_;
      for (int i=0; i<this->params_.num_inad_; ++i)
      {
        SearchVertexPtr vertex_copy = std::make_shared<SearchVertex>(goal_state);
        this->goal_vertex_->mha_copy_.push_back(vertex_copy);
        this->goal_vertex_->mha_copy_[i]->self_ptr_ = this->goal_vertex_;
      }
      
      // Start timer
      this->params_.start_time_ = Clock::now();
      
//      Suboptimality bound on current solution
//      @TODO Report the tigher suboptimality as done in the ARA Star paper.
//      for (const auto& incons_node: incons_)
//      {
//        double f_incons = this->env_ptr_->explored_[incons_node]->g_cost_ +
//          this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(incons_node);
//      }
      
      if (improvePath())
      {
        std::vector<StatePtr> path =
          this->backtrackPath(this->env_ptr_->getGoalState());
        anytime_stats_.solution_paths_.push_back(path);
        anytime_stats_.solution_eps_.push_back(this->params_.eps_*this->params_.mha_eps_);
        double unit_solution_time =
          duration_cast<duration<double> >(Clock::now() -
                                           this->params_.start_time_).count();
        anytime_stats_.solution_time_.push_back(unit_solution_time);
        anytime_stats_.cummulative_time_.push_back(duration_cast<duration<double> >(Clock::now() -
                                                                                    this->params_.start_time_).count());
      }
      
      double time_elapsed =
        duration_cast<duration<double> >(Clock::now() -
                                         this->params_.start_time_).count();
      
      // Updating w1 and w2
      this->params_.eps_ -= this->params_.delta_eps_;
      this->params_.mha_eps_ -= this->params_.delta_mha_eps_;
      
      // Outer loop
      while (this->params_.eps_ >= 1 &&
             this->params_.mha_eps_ >= 1 &&
             time_elapsed < this->params_.time_limit_)
      {
        // OPEN U INCONS and clearing CLOSED
        std::vector<SearchVertexPtr> open_u_incons;
        for (const auto& incons_state: incons_)
        {
          SearchVertexPtr incons_vertex = this->env_ptr_->explored_[incons_state];
          incons_vertex->f_cost_ = incons_vertex->g_cost_ +
                                   this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(incons_state);
          open_u_incons.push_back(incons_vertex);
        }
        while (this->open_.size() > 0)
        {
          SearchVertexPtr open_vertex =
            std::static_pointer_cast<SearchVertex>(this->open_.remove());
          open_vertex->f_cost_ = open_vertex->g_cost_ +
                                 this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(open_vertex->state_);
          open_u_incons.push_back(open_vertex);
        }
        
        for (const SearchVertexPtr& new_open : open_u_incons)
        {
          this->open_.insert(new_open);
          this->open_.decreaseKey(new_open,
                                  new_open->f_cost_);
        }
        
        this->closed_.clear();
        
        
        // OPEN_INAD U INCONS_INAD and clearing CLOSED_INAD
        for (int i=0; i<this->params_.num_inad_; ++i)
        {
          std::vector<SearchVertexPtr> open_inad_u_incons_inad;
          open_inad_u_incons_inad.reserve(open_inad_.size()+incons_inad_.size());
          for (const auto& incons_inad_state: incons_inad_)
          {
            SearchVertexPtr incons_inad_vertex = this->env_ptr_->explored_[incons_inad_state];
            incons_inad_vertex->mha_copy_[i]->f_cost_ = incons_inad_vertex->g_cost_ +
                                                        this->params_.eps_ *
                                                        this->env_ptr_->getInadmissibleHeuristicCost(incons_inad_state, i);
            open_inad_u_incons_inad.push_back(incons_inad_vertex->mha_copy_[i]);
          }
          while (open_inad_[i].size() > 0)
          {
            SearchVertexPtr open_inad_vertex =
              std::static_pointer_cast<SearchVertex>(open_inad_[i].remove());
            open_inad_vertex->f_cost_ = open_inad_vertex->self_ptr_->g_cost_ +
                                        this->params_.eps_ *
                                        this->env_ptr_->getInadmissibleHeuristicCost(open_inad_vertex->state_, i);
            open_inad_u_incons_inad.push_back(open_inad_vertex);
          }
          
          for (const SearchVertexPtr& new_open : open_inad_u_incons_inad)
          {
            open_inad_[i].insert(new_open);
            open_inad_[i].decreaseKey(new_open,
                                      new_open->f_cost_);
          }
        }
        
        closed_inad_.clear();
        
        if (improvePath())
        {
          std::vector<StatePtr> path =
            this->backtrackPath(this->env_ptr_->getGoalState());
          anytime_stats_.solution_paths_.push_back(path);
          anytime_stats_.solution_eps_.push_back(this->params_.eps_*this->params_.mha_eps_);
          double unit_solution_time = anytime_stats_.solution_time_.size()==0?
                                      duration_cast<duration<double> >(Clock::now() -
                                                                       this->params_.start_time_).count():
                                      duration_cast<duration<double> >(Clock::now() -
                                                                       this->params_.start_time_).count() -
                                      time_elapsed;
          anytime_stats_.solution_time_.push_back(unit_solution_time);
          anytime_stats_.cummulative_time_.push_back(duration_cast<duration<double> >(Clock::now() -
                                                                                      this->params_.start_time_).count());
        }
        
        // Epsilon update
        this->params_.eps_ -= this->params_.delta_eps_;
        this->params_.mha_eps_ -= this->params_.delta_mha_eps_;
        
        // Time elapsed update
        time_elapsed =
          duration_cast<duration<double> >(Clock::now() -
                                           this->params_.start_time_).count();
        
      }
      
      if (time_elapsed > this->params_.time_limit_ &&
          anytime_stats_.solution_paths_.size()==0)
      {
        std::cout << "[AMHAStar::run] Time limit exceeded and"
                     " no solution found... Exiting!" << std::endl;
        return false;
      }
      
      return true;
      
    }